

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# G1.c
# Opt level: O1

int G1_is_on_curve(G1 *op,ATE_CTX *ctx)

{
  fp_struct_st *pfVar1;
  fp_struct_st *pfVar2;
  int iVar3;
  fp_t ty;
  fp_t tx;
  G1 tmp;
  fp_struct_st fStack_d8;
  fp_struct_st local_b8;
  G1 local_90;
  
  G1_set(&local_90,op);
  G1_makeaffine(&local_90,ctx);
  pfVar1 = ctx->p;
  pfVar2 = ctx->n0;
  bn_mul_mont(&fStack_d8,local_90.m_y,local_90.m_y,pfVar1,pfVar2,4);
  bn_mul_mont(&local_b8,&local_90,&local_90,pfVar1,pfVar2,4);
  bn_mul_mont(&local_b8,&local_b8,&local_90,pfVar1,pfVar2,4);
  fp_add(&local_b8,&local_b8,ctx->b,pfVar1);
  iVar3 = fp_cmp(&local_b8,&fStack_d8);
  return (int)(iVar3 == 0);
}

Assistant:

int G1_is_on_curve(const G1 *op, const ATE_CTX *ctx)
{
    fp_t tx, ty;
    G1 tmp;
    G1_set(&tmp, op);
    G1_makeaffine(&tmp, ctx);

    fp_square(ty, tmp.m_y, ctx->p, ctx->n0); /* y^2 */
    fp_square(tx, tmp.m_x, ctx->p, ctx->n0);
    fp_mul(tx, tx, tmp.m_x, ctx->p, ctx->n0); /* x^3 */
    fp_add(tx, tx, ctx->b, ctx->p); /* x^3 + b */
    
    return fp_cmp(tx, ty) == 0;
}